

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

path * mp::GetExecutablePath(void)

{
  CStringRef message;
  SystemError *this;
  size_t sVar1;
  undefined8 uVar2;
  int *piVar3;
  size_t sVar4;
  path *in_RDI;
  char *s;
  ssize_t size;
  MemoryBuffer<char,_500UL,_std::allocator<char>_> buffer;
  size_t in_stack_fffffffffffffd58;
  MemoryBuffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  allocator<char> *in_stack_fffffffffffffd68;
  MemoryBuffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  int error_code;
  path *this_00;
  BasicCStringRef<char> local_248;
  size_t local_240;
  allocator<char> local_221;
  Buffer<char> local_220 [17];
  
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::MemoryBuffer
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::allocator<char>::~allocator(&local_221);
  fmt::Buffer<char>::resize((Buffer<char> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  local_240 = 0;
  while( true ) {
    message.data_ = fmt::Buffer<char>::operator[](local_220,0);
    this = (SystemError *)fmt::Buffer<char>::size(local_220);
    sVar1 = readlink("/proc/self/exe",message.data_,(size_t)this);
    local_240 = sVar1;
    if ((long)sVar1 < 0) {
      uVar2 = __cxa_allocate_exception(0x18);
      piVar3 = __errno_location();
      error_code = *piVar3;
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_248,"cannot get executable path");
      fmt::SystemError::SystemError(this,error_code,message);
      __cxa_throw(uVar2,&fmt::SystemError::typeinfo,fmt::SystemError::~SystemError);
    }
    sVar4 = fmt::Buffer<char>::size(local_220);
    if (sVar1 != sVar4) break;
    in_stack_fffffffffffffd60 =
         (MemoryBuffer<char,_500UL,_std::allocator<char>_> *)fmt::Buffer<char>::size(local_220);
    fmt::Buffer<char>::resize((Buffer<char> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  }
  fmt::Buffer<char>::operator[](local_220,0);
  path::path(this_00,(char *)in_RDI,message.data_);
  fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::~MemoryBuffer
            (in_stack_fffffffffffffd60);
  return this_00;
}

Assistant:

path mp::GetExecutablePath() {
  fmt::internal::MemoryBuffer<char, BUFFER_SIZE> buffer;
  buffer.resize(BUFFER_SIZE);
  ssize_t size = 0;
  for (;;) {
    size = readlink("/proc/self/exe", &buffer[0], buffer.size());
    if (size < 0)
      throw SystemError(errno, "cannot get executable path");
    if (static_cast<size_t>(size) != buffer.size()) break;
    buffer.resize(2 * buffer.size());
  }
  const char *s = &buffer[0];
  return path(s, s + size);
}